

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifySchemaAtToplevel(Parse *pToplevel,int iDb)

{
  int in_ESI;
  Parse *in_RDI;
  
  if (((in_RDI->cookieMask & 1 << ((byte)in_ESI & 0x1f)) == 0) &&
     (in_RDI->cookieMask = 1 << ((byte)in_ESI & 0x1f) | in_RDI->cookieMask, in_ESI == 1)) {
    sqlite3OpenTempDatabase(in_RDI);
  }
  return;
}

Assistant:

static void sqlite3CodeVerifySchemaAtToplevel(Parse *pToplevel, int iDb){
  assert( iDb>=0 && iDb<pToplevel->db->nDb );
  assert( pToplevel->db->aDb[iDb].pBt!=0 || iDb==1 );
  assert( iDb<SQLITE_MAX_DB );
  assert( sqlite3SchemaMutexHeld(pToplevel->db, iDb, 0) );
  if( DbMaskTest(pToplevel->cookieMask, iDb)==0 ){
    DbMaskSet(pToplevel->cookieMask, iDb);
    if( !OMIT_TEMPDB && iDb==1 ){
      sqlite3OpenTempDatabase(pToplevel);
    }
  }
}